

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Regexp * re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  uint uVar1;
  Regexp **sub_00;
  Regexp *pRVar2;
  Regexp **ppRVar3;
  Regexp *pRVar4;
  Regexp **ppRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  ulong uVar7;
  uint16_t uVar8;
  int i;
  ulong uVar9;
  int iVar10;
  
  uVar8 = (uint16_t)flags;
  if (nsub == 0) {
    pRVar2 = (Regexp *)operator_new(0x28);
    if (op == kRegexpAlternate) {
      pRVar2->op_ = '\x01';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = uVar8;
      pRVar2->ref_ = 1;
    }
    else {
      pRVar2->op_ = '\x02';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = uVar8;
      pRVar2->ref_ = 1;
    }
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->field_7).field_3.cc_ + 6) = 0;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined2 *)((long)&pRVar2->field_7 + 0xe) = 0;
    return pRVar2;
  }
  uVar9 = (ulong)(uint)nsub;
  if (nsub == 1) {
    return *sub;
  }
  if (can_factor && op == kRegexpAlternate) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < nsub) {
      uVar9 = (long)nsub << 3;
    }
    sub_00 = (Regexp **)operator_new__(uVar9);
    memcpy(sub_00,sub,(long)nsub << 3);
    uVar1 = FactorAlternation(sub_00,nsub,flags);
    if (uVar1 == 1) {
      pRVar2 = *sub_00;
      goto LAB_001bf2e9;
    }
    uVar9 = (ulong)uVar1;
    sub = sub_00;
  }
  else {
    sub_00 = (Regexp **)0x0;
  }
  iVar10 = (int)uVar9;
  if (0xffff < iVar10) {
    uVar1 = iVar10 + 0xfffe;
    pRVar2 = (Regexp *)operator_new(0x28);
    pRVar2->op_ = (uint8_t)op;
    pRVar2->simple_ = '\0';
    pRVar2->parse_flags_ = uVar8;
    pRVar2->ref_ = 1;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar2->field_7 + 0xe) = 0;
    ppRVar3 = (Regexp **)operator_new__((ulong)((uVar1 / 0xffff) * 8));
    (pRVar2->field_5).submany_ = ppRVar3;
    pRVar2->nsub_ = (uint16_t)(uVar1 / 0xffff);
    uVar1 = uVar1 / 0xffff - 1;
    uVar9 = 0;
    ppRVar5 = sub;
    do {
      pRVar4 = ConcatOrAlternate(op,ppRVar5,0xffff,flags,false);
      ppRVar3[uVar9] = pRVar4;
      uVar9 = uVar9 + 1;
      ppRVar5 = ppRVar5 + 0xffff;
    } while (uVar1 != uVar9);
    pRVar4 = ConcatOrAlternate(op,sub + uVar1 * 0xffff,iVar10 + uVar1 * -0xffff,flags,false);
    ppRVar3[uVar1] = pRVar4;
    if (sub_00 == (Regexp **)0x0) {
      return pRVar2;
    }
    operator_delete__(sub_00);
    return pRVar2;
  }
  pRVar2 = (Regexp *)operator_new(0x28);
  pRVar2->op_ = (uint8_t)op;
  pRVar2->simple_ = '\0';
  pRVar2->parse_flags_ = uVar8;
  pRVar2->ref_ = 1;
  *(undefined8 *)&pRVar2->nsub_ = 0;
  *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
  *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
  *(undefined8 *)((long)&(pRVar2->field_7).field_3.cc_ + 6) = 0;
  *(undefined2 *)((long)&pRVar2->field_7 + 0xe) = 0;
  if (1 < iVar10) {
    ppRVar5 = (Regexp **)operator_new__(uVar9 * 8);
    (pRVar2->field_5).submany_ = ppRVar5;
  }
  pRVar2->nsub_ = (ushort)uVar9;
  if ((ushort)uVar9 < 2) {
    paVar6 = &pRVar2->field_5;
  }
  else {
    paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
  }
  if (0 < iVar10) {
    uVar7 = 0;
    do {
      paVar6[uVar7] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(sub + uVar7);
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  if (sub_00 == (Regexp **)0x0) {
    return pRVar2;
  }
LAB_001bf2e9:
  operator_delete__(sub_00);
  return pRVar2;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  Regexp** subcopy = NULL;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = new Regexp*[nsub];
    memmove(subcopy, sub, nsub * sizeof sub[0]);
    sub = subcopy;
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      delete[] subcopy;
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    delete[] subcopy;
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];

  delete[] subcopy;
  return re;
}